

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersector1<8,_1048576,_false,_embree::avx2::ArrayIntersector1<embree::avx2::TriangleMIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Geometry *pGVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  ulong uVar11;
  undefined1 auVar12 [16];
  bool bVar13;
  undefined1 auVar14 [16];
  undefined4 uVar15;
  ulong *puVar16;
  ulong uVar17;
  ulong uVar18;
  ulong unaff_RBX;
  size_t mask;
  ulong uVar19;
  size_t sVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  uint uVar28;
  uint uVar30;
  undefined1 auVar29 [16];
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined8 uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  float fVar43;
  float fVar46;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  uint uVar56;
  uint uVar57;
  undefined1 auVar55 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [64];
  undefined1 auVar66 [16];
  undefined1 auVar67 [64];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [64];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [64];
  undefined1 auVar74 [16];
  undefined1 auVar75 [64];
  int local_1474;
  RTCIntersectArguments *local_1470;
  ulong local_1468;
  ulong local_1460;
  ulong local_1458;
  ulong local_1450;
  ulong local_1448;
  ulong local_1440;
  NodeRef *local_1438;
  RayQueryContext *local_1430;
  ulong local_1428;
  Scene *local_1420;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  float local_1338 [4];
  undefined1 local_1328 [16];
  float local_1318 [4];
  undefined1 local_1308 [16];
  undefined1 local_12f8 [16];
  undefined1 local_12e8 [16];
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  auVar14 = mm_lookupmask_ps._240_16_;
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar43 = ray->tfar;
    if (0.0 <= fVar43) {
      local_1438 = stack + 1;
      auVar9 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar1 = (ray->dir).field_0;
      auVar37._8_4_ = 0x7fffffff;
      auVar37._0_8_ = 0x7fffffff7fffffff;
      auVar37._12_4_ = 0x7fffffff;
      auVar8 = vandps_avx((undefined1  [16])aVar1,auVar37);
      auVar44._8_4_ = 0x219392ef;
      auVar44._0_8_ = 0x219392ef219392ef;
      auVar44._12_4_ = 0x219392ef;
      auVar8 = vcmpps_avx(auVar8,auVar44,1);
      auVar8 = vblendvps_avx((undefined1  [16])aVar1,auVar44,auVar8);
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar44 = vrcpps_avx(auVar8);
      auVar45._8_4_ = 0x3f800000;
      auVar45._0_8_ = &DAT_3f8000003f800000;
      auVar45._12_4_ = 0x3f800000;
      auVar8 = vfnmadd213ps_fma(auVar8,auVar44,auVar45);
      auVar12 = vfmadd132ps_fma(auVar8,auVar44,auVar44);
      fVar31 = auVar12._0_4_;
      local_11f8._4_4_ = fVar31;
      local_11f8._0_4_ = fVar31;
      local_11f8._8_4_ = fVar31;
      local_11f8._12_4_ = fVar31;
      local_11f8._16_4_ = fVar31;
      local_11f8._20_4_ = fVar31;
      local_11f8._24_4_ = fVar31;
      local_11f8._28_4_ = fVar31;
      auVar53 = ZEXT3264(local_11f8);
      auVar8 = vmovshdup_avx(auVar12);
      uVar36 = auVar8._0_8_;
      local_1218._8_8_ = uVar36;
      local_1218._0_8_ = uVar36;
      local_1218._16_8_ = uVar36;
      local_1218._24_8_ = uVar36;
      auVar55 = ZEXT3264(local_1218);
      auVar45 = vshufpd_avx(auVar12,auVar12,1);
      auVar44 = vshufps_avx(auVar12,auVar12,0xaa);
      auVar49._0_4_ = fVar31 * (ray->org).field_0.m128[0];
      auVar49._4_4_ = auVar12._4_4_ * (ray->org).field_0.m128[1];
      auVar49._8_4_ = auVar12._8_4_ * (ray->org).field_0.m128[2];
      auVar49._12_4_ = auVar12._12_4_ * (ray->org).field_0.m128[3];
      uVar36 = auVar44._0_8_;
      local_1238._8_8_ = uVar36;
      local_1238._0_8_ = uVar36;
      local_1238._16_8_ = uVar36;
      local_1238._24_8_ = uVar36;
      auVar59 = ZEXT3264(local_1238);
      auVar44 = vmovshdup_avx(auVar49);
      auVar12 = vshufps_avx(auVar49,auVar49,0xaa);
      local_1440 = (ulong)(fVar31 < 0.0) << 3;
      local_1448 = local_1440 ^ 8;
      local_1450 = (ulong)((uint)(auVar8._0_4_ < 0.0) * 8 + 0x10);
      local_1458 = local_1450 ^ 8;
      local_1460 = (ulong)((uint)(auVar45._0_4_ < 0.0) * 8 + 0x20);
      uVar22 = local_1460 ^ 8;
      uVar17 = CONCAT44(auVar49._0_4_,auVar49._0_4_);
      local_1258._0_8_ = uVar17 ^ 0x8000000080000000;
      local_1258._8_4_ = -auVar49._0_4_;
      local_1258._12_4_ = -auVar49._0_4_;
      local_1258._16_4_ = -auVar49._0_4_;
      local_1258._20_4_ = -auVar49._0_4_;
      local_1258._24_4_ = -auVar49._0_4_;
      local_1258._28_4_ = -auVar49._0_4_;
      auVar65 = ZEXT3264(local_1258);
      uVar28 = auVar44._0_4_;
      uVar30 = auVar44._4_4_;
      local_1278._0_8_ = auVar44._0_8_ ^ 0x8000000080000000;
      local_1278._8_4_ = uVar28 ^ 0x80000000;
      local_1278._12_4_ = uVar30 ^ 0x80000000;
      local_1278._16_4_ = uVar28 ^ 0x80000000;
      local_1278._20_4_ = uVar30 ^ 0x80000000;
      local_1278._24_4_ = uVar28 ^ 0x80000000;
      local_1278._28_4_ = uVar30 ^ 0x80000000;
      auVar67 = ZEXT3264(local_1278);
      uVar28 = auVar12._0_4_;
      uVar30 = auVar12._4_4_;
      local_1298._0_8_ = auVar12._0_8_ ^ 0x8000000080000000;
      local_1298._8_4_ = uVar28 ^ 0x80000000;
      local_1298._12_4_ = uVar30 ^ 0x80000000;
      local_1298._16_4_ = uVar28 ^ 0x80000000;
      local_1298._20_4_ = uVar30 ^ 0x80000000;
      local_1298._24_4_ = uVar28 ^ 0x80000000;
      local_1298._28_4_ = uVar30 ^ 0x80000000;
      auVar70 = ZEXT3264(local_1298);
      uVar15 = auVar9._0_4_;
      local_12b8._4_4_ = uVar15;
      local_12b8._0_4_ = uVar15;
      local_12b8._8_4_ = uVar15;
      local_12b8._12_4_ = uVar15;
      local_12b8._16_4_ = uVar15;
      local_12b8._20_4_ = uVar15;
      local_12b8._24_4_ = uVar15;
      local_12b8._28_4_ = uVar15;
      auVar73 = ZEXT3264(local_12b8);
      local_12d8._4_4_ = fVar43;
      local_12d8._0_4_ = fVar43;
      local_12d8._8_4_ = fVar43;
      local_12d8._12_4_ = fVar43;
      local_12d8._16_4_ = fVar43;
      local_12d8._20_4_ = fVar43;
      local_12d8._24_4_ = fVar43;
      local_12d8._28_4_ = fVar43;
      auVar75 = ZEXT3264(local_12d8);
      local_1430 = context;
      local_1468 = uVar22;
      do {
        if (local_1438 == stack) {
          return;
        }
        sVar20 = local_1438[-1].ptr;
        local_1438 = local_1438 + -1;
        do {
          if ((sVar20 & 8) == 0) {
            puVar16 = (ulong *)((sVar20 & 0xfffffffffffffff0) + 0x40);
            if ((sVar20 & 0xfffffffffffffff0) == 0) {
              puVar16 = (ulong *)0x0;
            }
            auVar8._8_8_ = 0;
            auVar8._0_8_ = *puVar16;
            auVar44 = vpmovzxbw_avx(auVar8);
            auVar9._8_8_ = 0;
            auVar9._0_8_ = puVar16[1];
            auVar8 = vpmovzxbw_avx(auVar9);
            auVar8 = vpminuw_avx(auVar44,auVar8);
            auVar8 = vpcmpeqw_avx(auVar44,auVar8);
            auVar8 = vpacksswb_avx(auVar8,auVar8);
            uVar15 = (undefined4)puVar16[6];
            auVar33._4_4_ = uVar15;
            auVar33._0_4_ = uVar15;
            auVar33._8_4_ = uVar15;
            auVar33._12_4_ = uVar15;
            auVar33._16_4_ = uVar15;
            auVar33._20_4_ = uVar15;
            auVar33._24_4_ = uVar15;
            auVar33._28_4_ = uVar15;
            uVar15 = *(undefined4 *)((long)puVar16 + 0x3c);
            auVar40._4_4_ = uVar15;
            auVar40._0_4_ = uVar15;
            auVar40._8_4_ = uVar15;
            auVar40._12_4_ = uVar15;
            auVar40._16_4_ = uVar15;
            auVar40._20_4_ = uVar15;
            auVar40._24_4_ = uVar15;
            auVar40._28_4_ = uVar15;
            auVar12._8_8_ = 0;
            auVar12._0_8_ = *(ulong *)((long)puVar16 + local_1440);
            auVar10 = vpmovzxbd_avx2(auVar12);
            auVar10 = vcvtdq2ps_avx(auVar10);
            auVar9 = vfmadd213ps_fma(auVar10,auVar40,auVar33);
            auVar2._8_8_ = 0;
            auVar2._0_8_ = *(ulong *)((long)puVar16 + local_1448);
            auVar10 = vpmovzxbd_avx2(auVar2);
            auVar10 = vcvtdq2ps_avx(auVar10);
            auVar44 = vfmadd213ps_fma(auVar10,auVar40,auVar33);
            uVar15 = *(undefined4 *)((long)puVar16 + 0x34);
            auVar34._4_4_ = uVar15;
            auVar34._0_4_ = uVar15;
            auVar34._8_4_ = uVar15;
            auVar34._12_4_ = uVar15;
            auVar34._16_4_ = uVar15;
            auVar34._20_4_ = uVar15;
            auVar34._24_4_ = uVar15;
            auVar34._28_4_ = uVar15;
            uVar15 = (undefined4)puVar16[8];
            auVar41._4_4_ = uVar15;
            auVar41._0_4_ = uVar15;
            auVar41._8_4_ = uVar15;
            auVar41._12_4_ = uVar15;
            auVar41._16_4_ = uVar15;
            auVar41._20_4_ = uVar15;
            auVar41._24_4_ = uVar15;
            auVar41._28_4_ = uVar15;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = *(ulong *)((long)puVar16 + local_1450);
            auVar10 = vpmovzxbd_avx2(auVar3);
            auVar10 = vcvtdq2ps_avx(auVar10);
            auVar45 = vfmadd213ps_fma(auVar10,auVar41,auVar34);
            auVar4._8_8_ = 0;
            auVar4._0_8_ = *(ulong *)((long)puVar16 + local_1458);
            auVar10 = vpmovzxbd_avx2(auVar4);
            auVar10 = vcvtdq2ps_avx(auVar10);
            auVar12 = vfmadd213ps_fma(auVar10,auVar41,auVar34);
            uVar15 = (undefined4)puVar16[7];
            auVar35._4_4_ = uVar15;
            auVar35._0_4_ = uVar15;
            auVar35._8_4_ = uVar15;
            auVar35._12_4_ = uVar15;
            auVar35._16_4_ = uVar15;
            auVar35._20_4_ = uVar15;
            auVar35._24_4_ = uVar15;
            auVar35._28_4_ = uVar15;
            uVar15 = *(undefined4 *)((long)puVar16 + 0x44);
            auVar42._4_4_ = uVar15;
            auVar42._0_4_ = uVar15;
            auVar42._8_4_ = uVar15;
            auVar42._12_4_ = uVar15;
            auVar42._16_4_ = uVar15;
            auVar42._20_4_ = uVar15;
            auVar42._24_4_ = uVar15;
            auVar42._28_4_ = uVar15;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = *(ulong *)((long)puVar16 + local_1460);
            auVar10 = vpmovzxbd_avx2(auVar5);
            auVar10 = vcvtdq2ps_avx(auVar10);
            auVar6._8_8_ = 0;
            auVar6._0_8_ = *(ulong *)((long)puVar16 + uVar22);
            auVar33 = vpmovzxbd_avx2(auVar6);
            auVar49 = vfmadd213ps_fma(auVar10,auVar42,auVar35);
            auVar10 = vcvtdq2ps_avx(auVar33);
            auVar2 = vfmadd213ps_fma(auVar10,auVar42,auVar35);
            auVar9 = vfmadd213ps_fma(ZEXT1632(auVar9),auVar53._0_32_,auVar65._0_32_);
            auVar45 = vfmadd213ps_fma(ZEXT1632(auVar45),auVar55._0_32_,auVar67._0_32_);
            auVar10 = vpmaxsd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar45));
            auVar9 = vfmadd213ps_fma(ZEXT1632(auVar49),auVar59._0_32_,auVar70._0_32_);
            auVar33 = vpmaxsd_avx2(ZEXT1632(auVar9),auVar73._0_32_);
            auVar10 = vpmaxsd_avx2(auVar10,auVar33);
            auVar9 = vfmadd213ps_fma(ZEXT1632(auVar44),auVar53._0_32_,auVar65._0_32_);
            auVar44 = vfmadd213ps_fma(ZEXT1632(auVar12),auVar55._0_32_,auVar67._0_32_);
            auVar33 = vpminsd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar44));
            auVar9 = vfmadd213ps_fma(ZEXT1632(auVar2),auVar59._0_32_,auVar70._0_32_);
            auVar34 = vpminsd_avx2(ZEXT1632(auVar9),auVar75._0_32_);
            auVar33 = vpminsd_avx2(auVar33,auVar34);
            auVar10 = vpcmpgtd_avx2(auVar10,auVar33);
            uVar15 = vmovmskps_avx(auVar10);
            unaff_RBX = (ulong)(byte)(~(byte)uVar15 &
                                     (SUB161(auVar8 >> 7,0) & 1 | (SUB161(auVar8 >> 0xf,0) & 1) << 1
                                      | (SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                                      (SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                                      (SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                                      (SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                                      (SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                                     SUB161(auVar8 >> 0x3f,0) << 7));
          }
          if ((sVar20 & 8) == 0) {
            if (unaff_RBX == 0) {
              iVar21 = 4;
            }
            else {
              uVar19 = sVar20 & 0xfffffffffffffff0;
              lVar23 = 0;
              for (uVar17 = unaff_RBX; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000)
              {
                lVar23 = lVar23 + 1;
              }
              iVar21 = 0;
              for (uVar17 = unaff_RBX - 1 & unaff_RBX; sVar20 = *(size_t *)(uVar19 + lVar23 * 8),
                  uVar17 != 0; uVar17 = uVar17 - 1 & uVar17) {
                local_1438->ptr = sVar20;
                local_1438 = local_1438 + 1;
                lVar23 = 0;
                for (uVar11 = uVar17; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000)
                {
                  lVar23 = lVar23 + 1;
                }
              }
            }
          }
          else {
            iVar21 = 6;
          }
        } while (iVar21 == 0);
        if (iVar21 == 6) {
          local_1428 = (ulong)((uint)sVar20 & 0xf) - 8;
          bVar24 = local_1428 != 0;
          if (bVar24) {
            uVar17 = sVar20 & 0xfffffffffffffff0;
            uVar22 = 0;
            do {
              lVar23 = uVar22 * 0xb0;
              auVar8 = *(undefined1 (*) [16])(uVar17 + 0x80 + lVar23);
              auVar9 = *(undefined1 (*) [16])(uVar17 + 0x40 + lVar23);
              auVar44 = *(undefined1 (*) [16])(uVar17 + 0x70 + lVar23);
              auVar45 = *(undefined1 (*) [16])(uVar17 + 0x50 + lVar23);
              auVar25._0_4_ = auVar8._0_4_ * auVar9._0_4_;
              auVar25._4_4_ = auVar8._4_4_ * auVar9._4_4_;
              auVar25._8_4_ = auVar8._8_4_ * auVar9._8_4_;
              auVar25._12_4_ = auVar8._12_4_ * auVar9._12_4_;
              local_1308 = vfmsub231ps_fma(auVar25,auVar44,auVar45);
              auVar12 = *(undefined1 (*) [16])(uVar17 + 0x60 + lVar23);
              auVar49 = *(undefined1 (*) [16])(uVar17 + 0x30 + lVar23);
              auVar26._0_4_ = auVar45._0_4_ * auVar12._0_4_;
              auVar26._4_4_ = auVar45._4_4_ * auVar12._4_4_;
              auVar26._8_4_ = auVar45._8_4_ * auVar12._8_4_;
              auVar26._12_4_ = auVar45._12_4_ * auVar12._12_4_;
              local_12f8 = vfmsub231ps_fma(auVar26,auVar8,auVar49);
              uVar15 = *(undefined4 *)&(ray->org).field_0;
              auVar60._4_4_ = uVar15;
              auVar60._0_4_ = uVar15;
              auVar60._8_4_ = uVar15;
              auVar60._12_4_ = uVar15;
              auVar2 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + lVar23),auVar60);
              uVar15 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar61._4_4_ = uVar15;
              auVar61._0_4_ = uVar15;
              auVar61._8_4_ = uVar15;
              auVar61._12_4_ = uVar15;
              auVar3 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x10 + lVar23),auVar61);
              uVar15 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar62._4_4_ = uVar15;
              auVar62._0_4_ = uVar15;
              auVar62._8_4_ = uVar15;
              auVar62._12_4_ = uVar15;
              auVar4 = vsubps_avx(*(undefined1 (*) [16])(uVar17 + 0x20 + lVar23),auVar62);
              fVar43 = (ray->dir).field_0.m128[0];
              auVar63._4_4_ = fVar43;
              auVar63._0_4_ = fVar43;
              auVar63._8_4_ = fVar43;
              auVar63._12_4_ = fVar43;
              fVar31 = (ray->dir).field_0.m128[1];
              auVar66._4_4_ = fVar31;
              auVar66._0_4_ = fVar31;
              auVar66._8_4_ = fVar31;
              auVar66._12_4_ = fVar31;
              fVar46 = (ray->dir).field_0.m128[2];
              auVar68._4_4_ = fVar46;
              auVar68._0_4_ = fVar46;
              auVar68._8_4_ = fVar46;
              auVar68._12_4_ = fVar46;
              auVar71._0_4_ = fVar43 * auVar3._0_4_;
              auVar71._4_4_ = fVar43 * auVar3._4_4_;
              auVar71._8_4_ = fVar43 * auVar3._8_4_;
              auVar71._12_4_ = fVar43 * auVar3._12_4_;
              auVar5 = vfmsub231ps_fma(auVar71,auVar2,auVar66);
              auVar58._0_4_ = auVar8._0_4_ * auVar5._0_4_;
              auVar58._4_4_ = auVar8._4_4_ * auVar5._4_4_;
              auVar58._8_4_ = auVar8._8_4_ * auVar5._8_4_;
              auVar58._12_4_ = auVar8._12_4_ * auVar5._12_4_;
              auVar72._0_4_ = auVar45._0_4_ * auVar5._0_4_;
              auVar72._4_4_ = auVar45._4_4_ * auVar5._4_4_;
              auVar72._8_4_ = auVar45._8_4_ * auVar5._8_4_;
              auVar72._12_4_ = auVar45._12_4_ * auVar5._12_4_;
              auVar54._0_4_ = fVar46 * auVar2._0_4_;
              auVar54._4_4_ = fVar46 * auVar2._4_4_;
              auVar54._8_4_ = fVar46 * auVar2._8_4_;
              auVar54._12_4_ = fVar46 * auVar2._12_4_;
              auVar45 = vfmsub231ps_fma(auVar54,auVar4,auVar63);
              auVar8 = vfmadd231ps_fma(auVar58,auVar45,auVar44);
              auVar45 = vfmadd231ps_fma(auVar72,auVar9,auVar45);
              auVar48._0_4_ = auVar49._0_4_ * auVar44._0_4_;
              auVar48._4_4_ = auVar49._4_4_ * auVar44._4_4_;
              auVar48._8_4_ = auVar49._8_4_ * auVar44._8_4_;
              auVar48._12_4_ = auVar49._12_4_ * auVar44._12_4_;
              local_12e8 = vfmsub231ps_fma(auVar48,auVar12,auVar9);
              auVar74._0_4_ = fVar31 * auVar4._0_4_;
              auVar74._4_4_ = fVar31 * auVar4._4_4_;
              auVar74._8_4_ = fVar31 * auVar4._8_4_;
              auVar74._12_4_ = fVar31 * auVar4._12_4_;
              auVar5 = vfmsub231ps_fma(auVar74,auVar3,auVar68);
              auVar69._0_4_ = fVar46 * local_12e8._0_4_;
              auVar69._4_4_ = fVar46 * local_12e8._4_4_;
              auVar69._8_4_ = fVar46 * local_12e8._8_4_;
              auVar69._12_4_ = fVar46 * local_12e8._12_4_;
              auVar9 = vfmadd231ps_fma(auVar69,local_12f8,auVar66);
              auVar44 = vfmadd231ps_fma(auVar9,local_1308,auVar63);
              auVar9 = vfmadd231ps_fma(auVar8,auVar5,auVar12);
              auVar50._8_8_ = 0x8000000080000000;
              auVar50._0_8_ = 0x8000000080000000;
              auVar8 = vandps_avx(auVar44,auVar50);
              uVar28 = auVar8._0_4_;
              auVar51._0_4_ = (float)(uVar28 ^ auVar9._0_4_);
              uVar30 = auVar8._4_4_;
              auVar51._4_4_ = (float)(uVar30 ^ auVar9._4_4_);
              uVar56 = auVar8._8_4_;
              auVar51._8_4_ = (float)(uVar56 ^ auVar9._8_4_);
              uVar57 = auVar8._12_4_;
              auVar51._12_4_ = (float)(uVar57 ^ auVar9._12_4_);
              auVar8 = vfmadd231ps_fma(auVar45,auVar49,auVar5);
              auVar52._0_4_ = (float)(uVar28 ^ auVar8._0_4_);
              auVar52._4_4_ = (float)(uVar30 ^ auVar8._4_4_);
              auVar52._8_4_ = (float)(uVar56 ^ auVar8._8_4_);
              auVar52._12_4_ = (float)(uVar57 ^ auVar8._12_4_);
              auVar45 = ZEXT416(0) << 0x20;
              auVar8 = vcmpps_avx(auVar51,auVar45,5);
              auVar9 = vcmpps_avx(auVar52,auVar45,5);
              auVar8 = vandps_avx(auVar9,auVar8);
              auVar9 = vandps_avx(auVar44,auVar37);
              auVar44 = vcmpps_avx(auVar44,auVar45,4);
              auVar8 = vandps_avx(auVar8,auVar44);
              auVar64._0_4_ = auVar52._0_4_ + auVar51._0_4_;
              auVar64._4_4_ = auVar52._4_4_ + auVar51._4_4_;
              auVar64._8_4_ = auVar52._8_4_ + auVar51._8_4_;
              auVar64._12_4_ = auVar52._12_4_ + auVar51._12_4_;
              auVar44 = vcmpps_avx(auVar64,auVar9,2);
              auVar8 = vandps_avx(auVar8,auVar44);
              auVar44 = auVar14 & auVar8;
              if ((((auVar44 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar44 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar44 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar44[0xf] < '\0') {
                auVar8 = vandps_avx(auVar8,auVar14);
                auVar38._0_4_ = local_12e8._0_4_ * auVar4._0_4_;
                auVar38._4_4_ = local_12e8._4_4_ * auVar4._4_4_;
                auVar38._8_4_ = local_12e8._8_4_ * auVar4._8_4_;
                auVar38._12_4_ = local_12e8._12_4_ * auVar4._12_4_;
                auVar44 = vfmadd213ps_fma(auVar3,local_12f8,auVar38);
                auVar44 = vfmadd213ps_fma(auVar2,local_1308,auVar44);
                auVar29._0_4_ = (float)(uVar28 ^ auVar44._0_4_);
                auVar29._4_4_ = (float)(uVar30 ^ auVar44._4_4_);
                auVar29._8_4_ = (float)(uVar56 ^ auVar44._8_4_);
                auVar29._12_4_ = (float)(uVar57 ^ auVar44._12_4_);
                fVar43 = (ray->org).field_0.m128[3];
                auVar32._0_4_ = auVar9._0_4_ * fVar43;
                auVar32._4_4_ = auVar9._4_4_ * fVar43;
                auVar32._8_4_ = auVar9._8_4_ * fVar43;
                auVar32._12_4_ = auVar9._12_4_ * fVar43;
                auVar44 = vcmpps_avx(auVar32,auVar29,1);
                fVar43 = ray->tfar;
                auVar39._0_4_ = auVar9._0_4_ * fVar43;
                auVar39._4_4_ = auVar9._4_4_ * fVar43;
                auVar39._8_4_ = auVar9._8_4_ * fVar43;
                auVar39._12_4_ = auVar9._12_4_ * fVar43;
                auVar45 = vcmpps_avx(auVar29,auVar39,2);
                auVar44 = vandps_avx(auVar45,auVar44);
                auVar45 = auVar8 & auVar44;
                if ((((auVar45 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar45 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar45[0xf] < '\0') {
                  auVar8 = vandps_avx(auVar8,auVar44);
                  local_1420 = local_1430->scene;
                  auVar44 = vrcpps_avx(auVar9);
                  auVar27._8_4_ = 0x3f800000;
                  auVar27._0_8_ = &DAT_3f8000003f800000;
                  auVar27._12_4_ = 0x3f800000;
                  auVar9 = vfnmadd213ps_fma(auVar9,auVar44,auVar27);
                  auVar9 = vfmadd132ps_fma(auVar9,auVar44,auVar44);
                  fVar43 = auVar9._0_4_;
                  fVar31 = auVar9._4_4_;
                  fVar46 = auVar9._8_4_;
                  fVar47 = auVar9._12_4_;
                  local_1318[0] = fVar43 * auVar29._0_4_;
                  local_1318[1] = fVar31 * auVar29._4_4_;
                  local_1318[2] = fVar46 * auVar29._8_4_;
                  local_1318[3] = fVar47 * auVar29._12_4_;
                  local_1338[0] = fVar43 * auVar51._0_4_;
                  local_1338[1] = fVar31 * auVar51._4_4_;
                  local_1338[2] = fVar46 * auVar51._8_4_;
                  local_1338[3] = fVar47 * auVar51._12_4_;
                  local_1328._0_4_ = fVar43 * auVar52._0_4_;
                  local_1328._4_4_ = fVar31 * auVar52._4_4_;
                  local_1328._8_4_ = fVar46 * auVar52._8_4_;
                  local_1328._12_4_ = fVar47 * auVar52._12_4_;
                  uVar15 = vmovmskps_avx(auVar8);
                  uVar19 = CONCAT44((int)((ulong)local_1420 >> 0x20),uVar15);
                  do {
                    uVar11 = 0;
                    for (uVar18 = uVar19; (uVar18 & 1) == 0;
                        uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                      uVar11 = uVar11 + 1;
                    }
                    h.geomID = *(uint *)(lVar23 + uVar17 + 0x90 + uVar11 * 4);
                    pGVar7 = (local_1420->geometries).items[h.geomID].ptr;
                    if ((pGVar7->mask & ray->mask) == 0) {
                      uVar19 = uVar19 ^ 1L << (uVar11 & 0x3f);
                      bVar13 = true;
                    }
                    else {
                      local_1470 = local_1430->args;
                      if ((local_1470->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar13 = false;
                      }
                      else {
                        uVar18 = (ulong)(uint)((int)uVar11 * 4);
                        h.u = *(float *)((long)local_1338 + uVar18);
                        h.v = *(float *)(local_1328 + uVar18);
                        args.context = local_1430->user;
                        h.primID = *(uint *)(lVar23 + uVar17 + 0xa0 + uVar18);
                        h.Ng.field_0.field_0.x = (float)*(undefined4 *)(local_1308 + uVar18);
                        h.Ng.field_0.field_0.y = (float)*(undefined4 *)(local_12f8 + uVar18);
                        h.Ng.field_0.field_0.z = (float)*(undefined4 *)(local_12e8 + uVar18);
                        h.instID[0] = (args.context)->instID[0];
                        h.instPrimID[0] = (args.context)->instPrimID[0];
                        fVar43 = ray->tfar;
                        ray->tfar = *(float *)((long)local_1318 + uVar18);
                        local_1474 = -1;
                        args.valid = &local_1474;
                        args.geometryUserPtr = pGVar7->userPtr;
                        args.hit = (RTCHitN *)&h;
                        args.N = 1;
                        args.ray = (RTCRayN *)ray;
                        if ((pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                           ((*pGVar7->occlusionFilterN)(&args), *args.valid != 0)) {
                          if (local_1470->filter != (RTCFilterFunctionN)0x0) {
                            if (((local_1470->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                              (*local_1470->filter)(&args);
                            }
                            if (*args.valid == 0) goto LAB_00530d87;
                          }
                          bVar13 = false;
                        }
                        else {
LAB_00530d87:
                          ray->tfar = fVar43;
                          uVar19 = uVar19 ^ 1L << (uVar11 & 0x3f);
                          bVar13 = true;
                        }
                      }
                    }
                    if (!bVar13) {
                      auVar53 = ZEXT3264(local_11f8);
                      auVar55 = ZEXT3264(local_1218);
                      auVar59 = ZEXT3264(local_1238);
                      auVar65 = ZEXT3264(local_1258);
                      auVar67 = ZEXT3264(local_1278);
                      auVar70 = ZEXT3264(local_1298);
                      auVar73 = ZEXT3264(local_12b8);
                      auVar75 = ZEXT3264(local_12d8);
                      iVar21 = 0;
                      uVar22 = local_1468;
                      if (bVar24) {
                        ray->tfar = -INFINITY;
                        iVar21 = 3;
                      }
                      goto LAB_00530e2a;
                    }
                  } while (uVar19 != 0);
                }
              }
              uVar22 = uVar22 + 1;
              bVar24 = uVar22 < local_1428;
            } while (uVar22 != local_1428);
            auVar53 = ZEXT3264(local_11f8);
            auVar55 = ZEXT3264(local_1218);
            auVar59 = ZEXT3264(local_1238);
            auVar65 = ZEXT3264(local_1258);
            auVar67 = ZEXT3264(local_1278);
            auVar70 = ZEXT3264(local_1298);
            auVar73 = ZEXT3264(local_12b8);
            auVar75 = ZEXT3264(local_12d8);
            uVar22 = local_1468;
          }
          iVar21 = 0;
        }
LAB_00530e2a:
      } while (iVar21 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }